

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

_Bool randart_file_exists(void)

{
  char *base;
  _Bool _Var1;
  char *pcVar2;
  char path [1024];
  char acStack_418 [1032];
  
  base = ANGBAND_DIR_ARCHIVE;
  pcVar2 = "";
  if (archive_user_pfx != (char *)0x0) {
    pcVar2 = archive_user_pfx;
  }
  pcVar2 = format("%srandart_%08lx.txt",pcVar2,(ulong)seed_randart);
  path_build(acStack_418,0x400,base,pcVar2);
  _Var1 = file_exists(acStack_418);
  return _Var1;
}

Assistant:

bool randart_file_exists(void)
{
	char path[1024];

	/* Get the randart filename and path */
	path_build(path, sizeof(path), ANGBAND_DIR_ARCHIVE,
			   format("%srandart_%08lx.txt", (archive_user_pfx) ?
					archive_user_pfx : "",
					(unsigned long)seed_randart));
	return file_exists(path);
}